

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

ogt_vox_scene *
ogt_vox_merge_scenes
          (ogt_vox_scene **scenes,uint32_t scene_count,ogt_vox_rgba *required_colors,
          uint32_t required_color_count)

{
  bool *pbVar1;
  float *pfVar2;
  ogt_vox_rgba *poVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ogt_vox_rgba oVar6;
  uint uVar7;
  ogt_vox_group *poVar8;
  char *pcVar9;
  ogt_vox_instance *poVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ogt_matl_type oVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ogt_vox_group *poVar32;
  uint32_t i;
  uint32_t uVar33;
  int iVar34;
  ulong uVar35;
  ogt_vox_layer *poVar36;
  long lVar37;
  ogt_vox_model *poVar38;
  size_t sVar39;
  uint32_t *puVar40;
  ogt_vox_model *poVar41;
  uint *puVar42;
  ulong uVar43;
  long lVar44;
  uint32_t color_index_2;
  ulong uVar45;
  int iVar46;
  undefined8 *puVar47;
  ulong uVar48;
  ogt_vox_instance *poVar49;
  long lVar50;
  ogt_vox_matl *poVar51;
  uint32_t color_index;
  uint32_t j;
  ogt_vox_keyframe_model *model_keyframes;
  ogt_vox_scene *poVar52;
  ogt_vox_scene *poVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  byte bVar57;
  float fVar58;
  uint local_4a68;
  uint32_t num_instances;
  ulong local_4a60;
  undefined8 local_4a58;
  uint local_4a50;
  uint32_t base_model_index;
  undefined8 local_4a48;
  undefined8 uStack_4a40;
  ulong local_4a30;
  ogt_vox_model **local_4a28;
  ogt_vox_instance *local_4a20;
  ulong local_4a18;
  ogt_vox_model **local_4a10;
  ogt_vox_group *local_4a08;
  ulong local_4a00;
  ulong local_49f8;
  uint32_t local_49ec;
  undefined8 local_49e8;
  float local_49e0;
  _vox_array<unsigned_int> per_scene_base_instance_index;
  _vox_array<unsigned_int> per_scene_base_model_index;
  undefined1 local_4978 [64];
  bool scene_used_mask [256];
  ogt_vox_rgba master_palette [256];
  uint32_t scene_color_index_to_master_map [256];
  ogt_vox_matl materials [256];
  
  bVar57 = 0;
  if (0xff < required_color_count) {
    __assert_fail("(required_color_count <= 255) && (\"too many colors specified\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xb6c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  memset(master_palette,0,0x400);
  memset(materials,0,0x4000);
  for (uVar45 = 1; uVar45 - required_color_count != 1; uVar45 = uVar45 + 1) {
    master_palette[uVar45] = required_colors[uVar45 - 1];
  }
  uVar35 = 0;
  local_4a68 = 1;
  uVar48 = 0;
  uVar43 = 0;
  while( true ) {
    local_4a50 = (uint)uVar43;
    local_49ec = (uint32_t)uVar48;
    if (scene_count == uVar35) break;
    poVar53 = scenes[uVar35];
    if (poVar53 != (ogt_vox_scene *)0x0) {
      uVar48 = (ulong)(local_49ec + poVar53->num_instances);
      uVar43 = (ulong)(local_4a50 + poVar53->num_models);
      local_4a68 = local_4a68 + poVar53->num_groups;
    }
    uVar35 = uVar35 + 1;
  }
  if (local_49ec == 0) {
    local_4a20 = (ogt_vox_instance *)0x0;
  }
  else {
    local_4a20 = (ogt_vox_instance *)(*g_alloc_func)(uVar48 * 0x78);
    uVar43 = (ulong)local_4a50;
  }
  if ((int)uVar43 == 0) {
    local_4a10 = (ogt_vox_model **)0x0;
  }
  else {
    local_4a10 = (ogt_vox_model **)(*g_alloc_func)(uVar43 << 3);
  }
  poVar36 = (ogt_vox_layer *)(*g_alloc_func)(0x10);
  local_4a08 = (ogt_vox_group *)(*g_alloc_func)((ulong)local_4a68 * 0x68);
  num_instances = 0;
  poVar36->hidden = false;
  (poVar36->color).r = 0xff;
  (poVar36->color).g = 0xff;
  (poVar36->color).b = 0xff;
  (poVar36->color).a = 0xff;
  poVar36->name = "merged";
  local_4a08->name = (char *)0x0;
  (local_4a08->transform).m00 = 1.0;
  (local_4a08->transform).m01 = 0.0;
  (local_4a08->transform).m02 = 0.0;
  (local_4a08->transform).m03 = 0.0;
  (local_4a08->transform).m10 = 0.0;
  (local_4a08->transform).m11 = 1.0;
  (local_4a08->transform).m12 = 0.0;
  (local_4a08->transform).m13 = 0.0;
  (local_4a08->transform).m20 = 0.0;
  (local_4a08->transform).m21 = 0.0;
  (local_4a08->transform).m22 = 1.0;
  (local_4a08->transform).m23 = 0.0;
  (local_4a08->transform).m30 = 0.0;
  (local_4a08->transform).m31 = 0.0;
  (local_4a08->transform).m32 = 0.0;
  *(undefined8 *)&(local_4a08->transform).m33 = 0xffffffff3f800000;
  local_4a08->layer_index = 0;
  local_4a08->hidden = false;
  (local_4a08->transform_anim).keyframes = (ogt_vox_keyframe_transform *)0x0;
  (local_4a08->transform_anim).num_keyframes = 0;
  local_4a30 = 0;
  (local_4a08->transform_anim).loop = false;
  per_scene_base_model_index.count = 0;
  per_scene_base_instance_index.count = 0;
  per_scene_base_model_index.data = (uint *)0x0;
  per_scene_base_model_index.capacity = 0;
  per_scene_base_instance_index.data = (uint *)0x0;
  per_scene_base_instance_index.capacity = 0;
  lVar50 = 0;
  local_4a60 = 1;
  local_4a58 = (ogt_vox_scene *)((ulong)local_4a58._4_4_ << 0x20);
  for (uVar35 = 0; local_4a00 = local_4a60 & 0xffffffff, uVar35 != scene_count; uVar35 = uVar35 + 1)
  {
    poVar53 = scenes[uVar35];
    if (poVar53 != (ogt_vox_scene *)0x0) {
      memset(scene_used_mask,0,0x100);
      uVar55 = poVar53->num_models;
      for (uVar43 = 0; uVar43 != uVar55; uVar43 = uVar43 + 1) {
        poVar41 = poVar53->models[uVar43];
        uVar33 = poVar41->size_y;
        uVar4 = poVar41->size_x;
        uVar5 = poVar41->size_z;
        for (uVar48 = 0; uVar33 * uVar4 * uVar5 != uVar48; uVar48 = uVar48 + 1) {
          scene_used_mask[poVar41->voxel_data[uVar48]] = true;
        }
      }
      scene_color_index_to_master_map[0] = 0;
      for (lVar37 = 1; lVar37 != 0x100; lVar37 = lVar37 + 1) {
        scene_color_index_to_master_map[lVar37] = 0xffffffff;
      }
      for (lVar37 = 1; uVar55 = (uint)uVar45, lVar37 != 0x100; lVar37 = lVar37 + 1) {
        if (scene_used_mask[lVar37] == true) {
          uVar45 = uVar45 & 0xffffffff;
          oVar6 = (poVar53->palette).color[lVar37];
          poVar51 = (poVar53->materials).matl + lVar37;
          for (uVar43 = 1; uVar43 < uVar45; uVar43 = uVar43 + 1) {
            if (((master_palette[uVar43].r == oVar6.r) && (master_palette[uVar43].g == oVar6.g)) &&
               (master_palette[uVar43].b == oVar6.b)) {
              if (uVar43 != 0xffffffff) {
                uVar55 = (uint)uVar43;
                goto LAB_00109d37;
              }
              break;
            }
          }
          if (uVar55 < 0x100) {
            master_palette[uVar45] = oVar6;
            oVar18 = poVar51->type;
            fVar58 = poVar51->metal;
            fVar19 = poVar51->rough;
            fVar20 = poVar51->spec;
            fVar21 = poVar51->ior;
            fVar22 = poVar51->att;
            fVar23 = poVar51->flux;
            fVar24 = poVar51->emit;
            fVar25 = poVar51->ldr;
            fVar26 = poVar51->trans;
            fVar27 = poVar51->alpha;
            fVar28 = poVar51->d;
            fVar29 = poVar51->sp;
            fVar30 = poVar51->g;
            fVar31 = poVar51->media;
            materials[uVar45].content_flags = poVar51->content_flags;
            materials[uVar45].type = oVar18;
            materials[uVar45].metal = fVar58;
            materials[uVar45].rough = fVar19;
            materials[uVar45].spec = fVar20;
            materials[uVar45].ior = fVar21;
            materials[uVar45].att = fVar22;
            materials[uVar45].flux = fVar23;
            materials[uVar45].emit = fVar24;
            materials[uVar45].ldr = fVar25;
            materials[uVar45].trans = fVar26;
            materials[uVar45].alpha = fVar27;
            materials[uVar45].d = fVar28;
            materials[uVar45].sp = fVar29;
            materials[uVar45].g = fVar30;
            materials[uVar45].media = fVar31;
            uVar45 = (ulong)(uVar55 + 1);
          }
          else {
            iVar34 = 0x7fffffff;
            uVar48 = 1;
            for (uVar43 = 1; uVar55 = (uint)uVar48, uVar45 != uVar43; uVar43 = uVar43 + 1) {
              iVar46 = ((uint)oVar6 & 0xff) - (uint)master_palette[uVar43].r;
              iVar54 = ((uint)oVar6 >> 8 & 0xff) - (uint)master_palette[uVar43].g;
              iVar56 = ((uint)oVar6 >> 0x10 & 0xff) - (uint)master_palette[uVar43].b;
              iVar46 = iVar56 * iVar56 + iVar54 * iVar54 + iVar46 * iVar46;
              if (iVar46 < iVar34) {
                uVar48 = uVar43 & 0xffffffff;
                iVar34 = iVar46;
              }
            }
            if (iVar34 == 0x7fffffff) {
              __assert_fail("(best_score < (2147483647)) && (\"degenerate palette\")",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                            ,0xb3a,
                            "uint32_t find_closest_color_in_palette(const ogt_vox_rgba *, uint32_t, const ogt_vox_rgba)"
                           );
            }
          }
LAB_00109d37:
          scene_color_index_to_master_map[lVar37] = uVar55;
        }
      }
      base_model_index = (uint32_t)local_4a58;
      _vox_array<unsigned_int>::push_back(&per_scene_base_model_index,&base_model_index);
      _vox_array<unsigned_int>::push_back(&per_scene_base_instance_index,&num_instances);
      for (uVar43 = 0; uVar43 < poVar53->num_models; uVar43 = uVar43 + 1) {
        poVar41 = poVar53->models[uVar43];
        uVar55 = poVar41->size_y * poVar41->size_x * poVar41->size_z;
        poVar38 = (ogt_vox_model *)(*g_alloc_func)((ulong)uVar55 + 0x18);
        for (uVar48 = 0; uVar55 != uVar48; uVar48 = uVar48 + 1) {
          if (0xff < scene_color_index_to_master_map[poVar41->voxel_data[uVar48]]) {
            __assert_fail("(new_color_index < 256) && (\"color index out of bounds\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                          ,0xbc4,
                          "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                         );
          }
          *(char *)((long)&poVar38[1].size_x + uVar48) =
               (char)scene_color_index_to_master_map[poVar41->voxel_data[uVar48]];
        }
        uVar33 = poVar41->size_y;
        uVar4 = poVar41->size_z;
        uVar5 = poVar41->voxel_hash;
        poVar38->size_x = poVar41->size_x;
        poVar38->size_y = uVar33;
        poVar38->size_z = uVar4;
        poVar38->voxel_hash = uVar5;
        poVar38->voxel_data = (uint8_t *)(poVar38 + 1);
        uVar33 = _vox_hash((uint8_t *)(poVar38 + 1),uVar55);
        poVar38->voxel_hash = uVar33;
        uVar48 = (ulong)local_4a58 & 0xffffffff;
        local_4a58 = (ogt_vox_scene *)CONCAT44(local_4a58._4_4_,(uint32_t)local_4a58 + 1);
        local_4a10[uVar48] = poVar38;
      }
      local_49f8 = (ulong)poVar53->num_instances;
      iVar34 = 0;
      local_4a18 = 0;
      if (poVar53->num_models != 0 && local_49f8 != 0) {
        local_4a28 = poVar53->models;
        poVar10 = poVar53->instances;
        iVar34 = 0x7ffffff;
        local_4a18 = 0xf8000001;
        for (uVar43 = 0; uVar43 != local_49f8; uVar43 = uVar43 + 1) {
          local_4a48 = (ogt_vox_scene *)CONCAT44(local_4a48._4_4_,iVar34);
          scene_used_mask._0_8_ = *(undefined8 *)&poVar10[uVar43].transform;
          scene_used_mask._8_8_ = *(undefined8 *)&poVar10[uVar43].transform.m02;
          scene_used_mask._16_8_ = *(undefined8 *)&poVar10[uVar43].transform.m10;
          scene_used_mask._24_8_ = *(undefined8 *)&poVar10[uVar43].transform.m12;
          scene_used_mask._32_8_ = *(undefined8 *)&poVar10[uVar43].transform.m20;
          scene_used_mask._40_8_ = *(undefined8 *)&poVar10[uVar43].transform.m22;
          scene_used_mask._48_8_ = *(undefined8 *)&poVar10[uVar43].transform.m30;
          scene_used_mask._56_8_ = *(undefined8 *)&poVar10[uVar43].transform.m32;
          puVar40 = &poVar10[uVar43].group_index;
          while (uVar48 = (ulong)*puVar40, uVar48 != 0xffffffff) {
            poVar8 = poVar53->groups;
            ogt_vox_transform_multiply
                      ((ogt_vox_transform *)local_4978,(ogt_vox_transform *)scene_used_mask,
                       &poVar8[uVar48].transform);
            scene_used_mask[0x30] = (bool)local_4978[0x30];
            scene_used_mask[0x31] = (bool)local_4978[0x31];
            scene_used_mask[0x32] = (bool)local_4978[0x32];
            scene_used_mask[0x33] = (bool)local_4978[0x33];
            scene_used_mask[0x34] = (bool)local_4978[0x34];
            scene_used_mask[0x35] = (bool)local_4978[0x35];
            scene_used_mask[0x36] = (bool)local_4978[0x36];
            scene_used_mask[0x37] = (bool)local_4978[0x37];
            scene_used_mask[0x38] = (bool)local_4978[0x38];
            scene_used_mask[0x39] = (bool)local_4978[0x39];
            scene_used_mask[0x3a] = (bool)local_4978[0x3a];
            scene_used_mask[0x3b] = (bool)local_4978[0x3b];
            scene_used_mask[0x3c] = (bool)local_4978[0x3c];
            scene_used_mask[0x3d] = (bool)local_4978[0x3d];
            scene_used_mask[0x3e] = (bool)local_4978[0x3e];
            scene_used_mask[0x3f] = (bool)local_4978[0x3f];
            scene_used_mask[0x20] = (bool)local_4978[0x20];
            scene_used_mask[0x21] = (bool)local_4978[0x21];
            scene_used_mask[0x22] = (bool)local_4978[0x22];
            scene_used_mask[0x23] = (bool)local_4978[0x23];
            scene_used_mask[0x24] = (bool)local_4978[0x24];
            scene_used_mask[0x25] = (bool)local_4978[0x25];
            scene_used_mask[0x26] = (bool)local_4978[0x26];
            scene_used_mask[0x27] = (bool)local_4978[0x27];
            scene_used_mask[0x28] = (bool)local_4978[0x28];
            scene_used_mask[0x29] = (bool)local_4978[0x29];
            scene_used_mask[0x2a] = (bool)local_4978[0x2a];
            scene_used_mask[0x2b] = (bool)local_4978[0x2b];
            scene_used_mask[0x2c] = (bool)local_4978[0x2c];
            scene_used_mask[0x2d] = (bool)local_4978[0x2d];
            scene_used_mask[0x2e] = (bool)local_4978[0x2e];
            scene_used_mask[0x2f] = (bool)local_4978[0x2f];
            scene_used_mask[0x10] = (bool)local_4978[0x10];
            scene_used_mask[0x11] = (bool)local_4978[0x11];
            scene_used_mask[0x12] = (bool)local_4978[0x12];
            scene_used_mask[0x13] = (bool)local_4978[0x13];
            scene_used_mask[0x14] = (bool)local_4978[0x14];
            scene_used_mask[0x15] = (bool)local_4978[0x15];
            scene_used_mask[0x16] = (bool)local_4978[0x16];
            scene_used_mask[0x17] = (bool)local_4978[0x17];
            scene_used_mask[0x18] = (bool)local_4978[0x18];
            scene_used_mask[0x19] = (bool)local_4978[0x19];
            scene_used_mask[0x1a] = (bool)local_4978[0x1a];
            scene_used_mask[0x1b] = (bool)local_4978[0x1b];
            scene_used_mask[0x1c] = (bool)local_4978[0x1c];
            scene_used_mask[0x1d] = (bool)local_4978[0x1d];
            scene_used_mask[0x1e] = (bool)local_4978[0x1e];
            scene_used_mask[0x1f] = (bool)local_4978[0x1f];
            scene_used_mask[0] = (bool)local_4978[0];
            scene_used_mask[1] = (bool)local_4978[1];
            scene_used_mask[2] = (bool)local_4978[2];
            scene_used_mask[3] = (bool)local_4978[3];
            scene_used_mask[4] = (bool)local_4978[4];
            scene_used_mask[5] = (bool)local_4978[5];
            scene_used_mask[6] = (bool)local_4978[6];
            scene_used_mask[7] = (bool)local_4978[7];
            scene_used_mask[8] = (bool)local_4978[8];
            scene_used_mask[9] = (bool)local_4978[9];
            scene_used_mask[10] = (bool)local_4978[10];
            scene_used_mask[0xb] = (bool)local_4978[0xb];
            scene_used_mask[0xc] = (bool)local_4978[0xc];
            scene_used_mask[0xd] = (bool)local_4978[0xd];
            scene_used_mask[0xe] = (bool)local_4978[0xe];
            scene_used_mask[0xf] = (bool)local_4978[0xf];
            puVar40 = &poVar8[uVar48].parent_group_index;
          }
          poVar41 = local_4a28[poVar10[uVar43].model_index];
          if (((float)scene_used_mask._0_4_ == 0.0) && (!NAN((float)scene_used_mask._0_4_))) {
            if (((float)scene_used_mask._16_4_ != 0.0) || (NAN((float)scene_used_mask._16_4_))) {
              poVar41 = (ogt_vox_model *)&poVar41->size_y;
            }
            else if (((float)scene_used_mask._32_4_ != 0.0) || (NAN((float)scene_used_mask._32_4_)))
            {
              poVar41 = (ogt_vox_model *)&poVar41->size_z;
            }
          }
          iVar34 = (int)poVar41->size_x / 2;
          iVar46 = (int)(float)scene_used_mask._48_4_ - iVar34;
          uVar55 = iVar34 + (int)(float)scene_used_mask._48_4_;
          iVar34 = (uint32_t)local_4a48;
          if (iVar46 < (int)(uint32_t)local_4a48) {
            iVar34 = iVar46;
          }
          iVar46 = (int)local_4a18;
          local_4a18 = local_4a18 & 0xffffffff;
          if (iVar46 < (int)uVar55) {
            local_4a18 = (ulong)uVar55;
          }
        }
      }
      if (poVar53->groups->parent_group_index != 0xffffffff) {
        __assert_fail("(scene->groups[0].parent_group_index == k_invalid_group_index) && (\"first group of scene must not be parented to any other group\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0xbd7,
                      "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                     );
      }
      uVar55 = (int)local_4a30 - iVar34;
      local_4a30 = (ulong)uVar55;
      local_4a28 = (ogt_vox_model **)CONCAT44(local_4a28._4_4_,(float)(int)uVar55);
      local_4a60 = (ulong)((int)local_4a60 - 1);
      lVar37 = 200;
      for (uVar43 = 1; uVar43 < poVar53->num_groups; uVar43 = uVar43 + 1) {
        poVar8 = poVar53->groups;
        uVar55 = *(uint *)((long)poVar8 + lVar37 + -0x18);
        if (uVar55 == 0xffffffff) {
          __assert_fail("(src_group->parent_group_index != k_invalid_group_index) && (\"all groups after the first in the scene must be parented to a valid group\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbdb,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        pcVar9 = *(char **)((long)poVar8 + lVar37 + -0x60);
        pbVar1 = (bool *)((long)poVar8 + lVar37 + -0x38);
        scene_used_mask._32_8_ = *(undefined8 *)pbVar1;
        scene_used_mask._40_8_ = *(undefined8 *)(pbVar1 + 8);
        pbVar1 = (bool *)((long)poVar8 + lVar37 + -0x48);
        scene_used_mask._16_8_ = *(undefined8 *)pbVar1;
        scene_used_mask._24_8_ = *(undefined8 *)(pbVar1 + 8);
        pbVar1 = (bool *)((long)poVar8 + lVar37 + -0x58);
        scene_used_mask._0_8_ = *(undefined8 *)pbVar1;
        scene_used_mask._8_8_ = *(undefined8 *)(pbVar1 + 8);
        fVar58 = *(float *)((long)poVar8 + lVar37 + -0x28);
        local_49e0 = *(float *)((long)poVar8 + lVar37 + -0x1c);
        local_49e8 = *(undefined8 *)((long)poVar8 + lVar37 + -0x24);
        pbVar1 = (bool *)((long)poVar8 + lVar37 + -0x10);
        local_4978._0_8_ = *(undefined8 *)pbVar1;
        local_4978._8_8_ = *(undefined8 *)(pbVar1 + 8);
        if (poVar53->num_groups <= uVar55) {
          __assert_fail("(dst_group.parent_group_index < scene->num_groups) && (\"group index is out of bounds\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbdd,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        local_4a48 = *(ogt_vox_scene **)((long)&poVar8->name + lVar37);
        uStack_4a40 = 0;
        uVar33 = (int)local_4a60 + uVar55;
        if (uVar55 == 0) {
          uVar33 = 0;
        }
        if (pcVar9 != (char *)0x0) {
          local_49f8 = CONCAT44(local_49f8._4_4_,fVar58);
          sVar39 = strlen(pcVar9);
          lVar50 = lVar50 + sVar39 + 1;
          fVar58 = (float)local_49f8;
        }
        if (uVar33 == 0) {
          fVar58 = fVar58 + local_4a28._0_4_;
        }
        uVar55 = ((int)local_4a00 + (int)uVar43) - 1;
        lVar50 = lVar50 + ((ulong)local_4a48 & 0xffffffff) * 0x44;
        local_4a08[uVar55].name = pcVar9;
        *(undefined8 *)&local_4a08[uVar55].transform = scene_used_mask._0_8_;
        *(undefined8 *)&local_4a08[uVar55].transform.m02 = scene_used_mask._8_8_;
        pfVar2 = &local_4a08[uVar55].transform.m10;
        *(undefined8 *)pfVar2 = scene_used_mask._16_8_;
        *(undefined8 *)(pfVar2 + 2) = scene_used_mask._24_8_;
        pfVar2 = &local_4a08[uVar55].transform.m20;
        *(undefined8 *)pfVar2 = scene_used_mask._32_8_;
        *(undefined8 *)(pfVar2 + 2) = scene_used_mask._40_8_;
        local_4a08[uVar55].transform.m30 = fVar58;
        local_4a08[uVar55].transform.m31 = (float)(undefined4)local_49e8;
        local_4a08[uVar55].transform.m32 = (float)local_49e8._4_4_;
        local_4a08[uVar55].transform.m33 = local_49e0;
        local_4a08[uVar55].parent_group_index = uVar33;
        local_4a08[uVar55].layer_index = 0;
        *(undefined8 *)&local_4a08[uVar55].hidden = local_4978._0_8_;
        ((ogt_vox_anim_transform *)(&local_4a08[uVar55].hidden + 8))->keyframes =
             (ogt_vox_keyframe_transform *)local_4978._8_8_;
        puVar40 = &local_4a08[uVar55].transform_anim.num_keyframes;
        *puVar40 = (uint32_t)local_4a48;
        puVar40[1] = local_4a48._4_4_;
        lVar37 = lVar37 + 0x68;
      }
      local_4a48 = (ogt_vox_scene *)((local_4a00 + uVar43) - 1);
      lVar37 = 0;
      for (uVar43 = 0; uVar43 < poVar53->num_instances; uVar43 = uVar43 + 1) {
        if (poVar53->num_groups <= *(uint *)((long)&poVar53->instances->group_index + lVar37)) {
          __assert_fail("(src_instance->group_index < scene->num_groups) && (\"group index is out of bounds\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbed,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        uVar48 = (ulong)num_instances;
        num_instances = num_instances + 1;
        poVar10 = local_4a20 + uVar48;
        puVar47 = (undefined8 *)((long)&poVar53->instances->name + lVar37);
        poVar49 = poVar10;
        for (lVar44 = 0xf; lVar44 != 0; lVar44 = lVar44 + -1) {
          poVar49->name = (char *)*puVar47;
          puVar47 = puVar47 + (ulong)bVar57 * -2 + 1;
          poVar49 = (ogt_vox_instance *)((long)poVar49 + (ulong)bVar57 * -0x10 + 8);
        }
        local_4a20[uVar48].layer_index = 0;
        uVar33 = (int)local_4a60 + local_4a20[uVar48].group_index;
        if (local_4a20[uVar48].group_index == 0) {
          uVar33 = 0;
        }
        local_4a20[uVar48].group_index = uVar33;
        local_4a20[uVar48].model_index = local_4a20[uVar48].model_index + base_model_index;
        if (local_4a20[uVar48].name != (char *)0x0) {
          sVar39 = strlen(local_4a20[uVar48].name);
          lVar50 = lVar50 + sVar39 + 1;
        }
        uVar55 = (poVar10->transform_anim).num_keyframes;
        uVar7 = (poVar10->model_anim).num_keyframes;
        if (uVar33 == 0) {
          (poVar10->transform).m30 = (poVar10->transform).m30 + local_4a28._0_4_;
        }
        lVar50 = (ulong)uVar55 * 0x44 + lVar50 + (ulong)uVar7 * 8;
        lVar37 = lVar37 + 0x78;
      }
      local_4a30 = (ulong)((int)local_4a30 + (int)local_4a18 + 4);
      local_4a60 = (ulong)local_4a48;
    }
  }
  for (uVar45 = uVar45 & 0xffffffff; uVar45 < 0x100; uVar45 = uVar45 + 1) {
    poVar3 = master_palette + uVar45;
    poVar3->r = 0xff;
    poVar3->g = '\0';
    poVar3->b = 0xff;
    poVar3->a = 0xff;
  }
  local_4a48 = (ogt_vox_scene *)_vox_calloc(lVar50 + 0x4440);
  poVar53 = local_4a48 + 1;
  uVar45 = 0;
  local_4a58 = poVar53;
  do {
    poVar8 = local_4a08;
    if (num_instances <= uVar45) {
      lVar37 = local_4a00 * 0x68;
      for (lVar44 = 0; poVar32 = local_4a08, poVar52 = local_4a48, lVar37 - lVar44 != 0;
          lVar44 = lVar44 + 0x68) {
        pcVar9 = *(char **)((long)&poVar8->name + lVar44);
        if (pcVar9 != (char *)0x0) {
          sVar39 = strlen(pcVar9);
          memcpy(poVar53,pcVar9,sVar39 + 1);
          *(ogt_vox_scene **)((long)&poVar8->name + lVar44) = poVar53;
          poVar53 = (ogt_vox_scene *)((long)(poVar53->palette).color + (sVar39 - 0x2f));
        }
        iVar34 = *(int *)((long)&(poVar8->transform_anim).num_keyframes + lVar44);
        if (iVar34 != 0) {
          uVar45 = (ulong)(uint)(iVar34 * 0x44);
          memcpy(poVar53,*(void **)((long)&(poVar8->transform_anim).keyframes + lVar44),uVar45);
          *(ogt_vox_scene **)((long)&(poVar8->transform_anim).keyframes + lVar44) = poVar53;
          poVar53 = (ogt_vox_scene *)((long)((poVar53->palette).color + -0xc) + uVar45);
        }
      }
      if (poVar53 <= (ogt_vox_scene *)((long)((local_4a58->palette).color + -0xc) + lVar50)) {
        uVar55 = (uint)local_4a60;
        if (uVar55 <= local_4a68) {
          memset(&local_4a48->palette,0,0x4410);
          poVar52->instances = local_4a20;
          poVar52->num_instances = local_49ec;
          poVar52->models = local_4a10;
          poVar52->num_models = local_4a50;
          poVar52->layers = poVar36;
          poVar52->num_layers = 1;
          poVar52->groups = poVar32;
          poVar52->num_groups = uVar55;
          for (lVar50 = 0; lVar50 != 0x100; lVar50 = lVar50 + 1) {
            (poVar52->palette).color[lVar50] = master_palette[lVar50];
          }
          for (lVar50 = 0; lVar50 != 0x4000; lVar50 = lVar50 + 0x40) {
            uVar11 = *(undefined8 *)((long)&materials[0].content_flags + lVar50);
            uVar12 = *(undefined8 *)((long)&materials[0].metal + lVar50);
            uVar13 = *(undefined8 *)((long)&materials[0].spec + lVar50);
            uVar14 = *(undefined8 *)((long)&materials[0].att + lVar50);
            uVar15 = *(undefined8 *)((long)&materials[0].emit + lVar50);
            uVar16 = *(undefined8 *)((long)&materials[0].trans + lVar50);
            uVar17 = *(undefined8 *)((long)&materials[0].g + lVar50);
            puVar47 = (undefined8 *)((long)&(poVar52->materials).matl[0].d + lVar50);
            *puVar47 = *(undefined8 *)((long)&materials[0].d + lVar50);
            puVar47[1] = uVar17;
            puVar47 = (undefined8 *)((long)&(poVar52->materials).matl[0].emit + lVar50);
            *puVar47 = uVar15;
            puVar47[1] = uVar16;
            puVar47 = (undefined8 *)((long)&(poVar52->materials).matl[0].spec + lVar50);
            *puVar47 = uVar13;
            puVar47[1] = uVar14;
            puVar47 = (undefined8 *)((long)&(poVar52->materials).matl[0].content_flags + lVar50);
            *puVar47 = uVar11;
            puVar47[1] = uVar12;
          }
          _vox_array<unsigned_int>::~_vox_array(&per_scene_base_instance_index);
          _vox_array<unsigned_int>::~_vox_array(&per_scene_base_model_index);
          return poVar52;
        }
        __assert_fail("(num_groups <= max_groups) && (\"sanity check failed. we wrote more groups than we allocated\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0xc3f,
                      "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                     );
      }
      __assert_fail("(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size)) && (\"misc_data allocation was overrun\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0xc3c,
                    "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                   );
    }
    poVar10 = local_4a20 + uVar45;
    pcVar9 = local_4a20[uVar45].name;
    poVar52 = poVar53;
    if (pcVar9 != (char *)0x0) {
      sVar39 = strlen(pcVar9);
      memcpy(poVar53,pcVar9,sVar39 + 1);
      poVar10->name = (char *)poVar53;
      poVar52 = (ogt_vox_scene *)((long)(poVar53->palette).color + (sVar39 - 0x2f));
    }
    uVar33 = (poVar10->model_anim).num_keyframes;
    poVar53 = poVar52;
    if (uVar33 != 0) {
      uVar35 = (ulong)(uVar33 << 3);
      memcpy(poVar52,(poVar10->model_anim).keyframes,uVar35);
      (poVar10->model_anim).keyframes = (ogt_vox_keyframe_model *)poVar52;
      poVar53 = (ogt_vox_scene *)((long)((poVar52->palette).color + -0xc) + uVar35);
      uVar35 = per_scene_base_instance_index.count & 0xffffffff;
      do {
        uVar35 = uVar35 - 1;
        if ((int)(uint)uVar35 < 0) goto LAB_0010a38f;
        uVar43 = (ulong)((uint)uVar35 & 0x7fffffff);
        puVar42 = _vox_array<unsigned_int>::operator[](&per_scene_base_instance_index,uVar43);
      } while (uVar45 < *puVar42);
      for (uVar35 = 0; uVar35 < (poVar10->model_anim).num_keyframes; uVar35 = uVar35 + 1) {
        puVar42 = _vox_array<unsigned_int>::operator[](&per_scene_base_model_index,uVar43);
        poVar3 = (poVar52->palette).color + uVar35 * 2 + -0xb;
        *poVar3 = (ogt_vox_rgba)((int)*poVar3 + *puVar42);
      }
    }
LAB_0010a38f:
    uVar33 = (poVar10->transform_anim).num_keyframes;
    if (uVar33 != 0) {
      uVar35 = (ulong)(uVar33 * 0x44);
      memcpy(poVar53,(poVar10->transform_anim).keyframes,uVar35);
      (poVar10->transform_anim).keyframes = (ogt_vox_keyframe_transform *)poVar53;
      poVar53 = (ogt_vox_scene *)((long)((poVar53->palette).color + -0xc) + uVar35);
    }
    uVar45 = uVar45 + 1;
  } while( true );
}

Assistant:

ogt_vox_scene* ogt_vox_merge_scenes(const ogt_vox_scene** scenes, uint32_t scene_count, const ogt_vox_rgba* required_colors, const uint32_t required_color_count) {
        ogt_assert(required_color_count <= 255, "too many colors specified"); // can't exceed the maximum colors in the master palette plus the empty slot.

        // initialize the master palette. If required colors are specified, map them into the master palette now.
        ogt_vox_rgba  master_palette[256];
        ogt_vox_matl materials[256];
        uint32_t master_palette_count = 1;          // color_index 0 is reserved for empty color!
        memset(&master_palette, 0, sizeof(master_palette));
        memset(&materials, 0, sizeof(materials));
        for (uint32_t required_index = 0; required_index < required_color_count; required_index++)
            master_palette[master_palette_count++] = required_colors[required_index];

        // count the number of required models, instances in the master scene
        uint32_t max_layers = 1;  // we don't actually merge layers. Every instance will be in layer 0.
        uint32_t max_models = 0;
        uint32_t max_instances = 0;
        uint32_t max_groups = 1;  // we add 1 root global group that everything will ultimately be parented to.
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            if (!scenes[scene_index])
                continue;
            max_instances += scenes[scene_index]->num_instances;
            max_models += scenes[scene_index]->num_models;
            max_groups += scenes[scene_index]->num_groups;
        }

        // allocate the master instances array
        ogt_vox_instance* instances     = (ogt_vox_instance*)_vox_malloc(sizeof(ogt_vox_instance) * max_instances);
        ogt_vox_model**   models        = (ogt_vox_model**)_vox_malloc(sizeof(ogt_vox_model*) * max_models);
        ogt_vox_layer*    layers        = (ogt_vox_layer*)_vox_malloc(sizeof(ogt_vox_layer) * max_layers);
        ogt_vox_group*    groups        = (ogt_vox_group*)_vox_malloc(sizeof(ogt_vox_group) * max_groups);
        uint32_t          num_instances = 0;
        uint32_t          num_models    = 0;
        uint32_t          num_layers    = 0;

        // add a single layer.
        layers[num_layers].hidden = false;
        layers[num_layers].color  = {255, 255, 255, 255};
        layers[num_layers].name = "merged";
        num_layers++;

        // magicavoxel expects exactly 1 root group, so if we have multiple scenes with multiple roots,
        // we must ensure all merged scenes are parented to the same root group. Allocate it now for the
        // merged scene.
        uint32_t global_root_group_index = 0;
        {
            ogt_vox_group root_group;
            root_group.name                    = NULL;
            root_group.hidden                  = false;
            root_group.layer_index             = 0;
            root_group.parent_group_index      = k_invalid_group_index;
            root_group.transform               = ogt_vox_transform_get_identity();
            clear_anim_transform(&root_group.transform_anim);
            groups[0] = root_group;
        }
        uint32_t num_groups = 1; // we just wrote the global root group index, so all per-scene groups are allocated after.

        // go ahead and do the merge now!
        _vox_array<uint32_t> per_scene_base_model_index;
        _vox_array<uint32_t> per_scene_base_instance_index;
        size_t misc_data_size = 0;
        int32_t offset_x = 0;
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            const ogt_vox_scene* scene = scenes[scene_index];
            if (!scene)
                continue;

            // update the master palette, and get the map of this scene's color indices into the master palette.
            uint32_t scene_color_index_to_master_map[256];
            update_master_palette_and_materials_from_scene(master_palette, master_palette_count, scene, scene_color_index_to_master_map, materials);

            // cache away the base model index for this scene.
            uint32_t base_model_index = num_models;
            uint32_t base_group_index = num_groups;

            per_scene_base_model_index.push_back(base_model_index);
            per_scene_base_instance_index.push_back(num_instances);

            // create copies of all models that have color indices remapped.
            for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
                const ogt_vox_model* model = scene->models[model_index];
                uint32_t voxel_count = model->size_x * model->size_y * model->size_z;
                // clone the model
                ogt_vox_model* override_model = (ogt_vox_model*)_vox_malloc(sizeof(ogt_vox_model) + voxel_count);
                uint8_t * override_voxel_data = (uint8_t*)& override_model[1];

                // remap all color indices in the cloned model so they reference the master palette now!
                for (uint32_t voxel_index = 0; voxel_index < voxel_count; voxel_index++) {
                    uint8_t  old_color_index = model->voxel_data[voxel_index];
                    uint32_t new_color_index = scene_color_index_to_master_map[old_color_index];
                    ogt_assert(new_color_index < 256, "color index out of bounds");
                    override_voxel_data[voxel_index] = (uint8_t)new_color_index;
                }
                // assign the new model.
                *override_model = *model;
                override_model->voxel_data = override_voxel_data;
                override_model->voxel_hash = _vox_hash(override_voxel_data, voxel_count);

                models[num_models++] = override_model;
            }

            // compute the scene bounding box on x dimension. this is used to offset instances
            // and groups in the merged model along X dimension such that they do not overlap
            // with instances from another scene in the merged model.
            int32_t scene_min_x, scene_max_x;
            compute_scene_bounding_box_x(scene, scene_min_x, scene_max_x);
            float scene_offset_x = (float)(offset_x - scene_min_x);

            // each scene has a root group, and it must the 0th group in its local groups[] array,
            ogt_assert(scene->groups[0].parent_group_index == k_invalid_group_index, "first group of scene must not be parented to any other group");
            // create copies of all groups into the merged scene (except the root group from each scene -- which is why we start group_index at 1 here)
            for (uint32_t group_index = 1; group_index < scene->num_groups; group_index++) {
                const ogt_vox_group* src_group = &scene->groups[group_index];
                ogt_assert(src_group->parent_group_index != k_invalid_group_index, "all groups after the first in the scene must be parented to a valid group"); // there can be only 1 root group per scene and it must be the 0th group.
                ogt_vox_group dst_group = *src_group;
                ogt_assert(dst_group.parent_group_index < scene->num_groups, "group index is out of bounds");
                dst_group.layer_index        = 0;
                dst_group.parent_group_index = (dst_group.parent_group_index == 0) ? global_root_group_index : base_group_index + (dst_group.parent_group_index - 1);
                if (dst_group.name)
                    misc_data_size += _vox_strlen(dst_group.name) + 1; // + 1 for zero terminator
                if (dst_group.transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_group.transform_anim.num_keyframes);
                // if this group belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_group.parent_group_index == global_root_group_index)
                    dst_group.transform.m30 += scene_offset_x;
                groups[num_groups++] = dst_group;
            }

            // create copies of all instances (and bias them such that minimum on x starts at zero)
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* src_instance = &scene->instances[instance_index];
                ogt_assert(src_instance->group_index < scene->num_groups, "group index is out of bounds");  // every instance must be mapped to a group.
                ogt_vox_instance* dst_instance = &instances[num_instances++];
                *dst_instance = *src_instance;
                dst_instance->layer_index = 0;
                dst_instance->group_index = (dst_instance->group_index == 0) ? global_root_group_index : base_group_index + (dst_instance->group_index - 1);
                dst_instance->model_index += base_model_index;
                if (dst_instance->name)
                    misc_data_size += _vox_strlen(dst_instance->name) + 1; // + 1 for zero terminator
                if (dst_instance->transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_instance->transform_anim.num_keyframes);
                if (dst_instance->model_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_model) * dst_instance->model_anim.num_keyframes);

                // if this instance belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_instance->group_index == global_root_group_index)
                    dst_instance->transform.m30 += scene_offset_x;
            }

            offset_x += (scene_max_x - scene_min_x); // step the width of the scene in x dimension
            offset_x += 4;                           // a margin of this many voxels between scenes
        }

        // fill any unused master palette entries with purple/invalid color.
        const ogt_vox_rgba k_invalid_color = { 255, 0, 255, 255 };  // purple = invalid
        for (uint32_t color_index = master_palette_count; color_index < 256; color_index++)
            master_palette[color_index] = k_invalid_color;

        // assign the master scene on output. misc_data is part of the scene allocation.
        size_t scene_size = sizeof(ogt_vox_scene) + misc_data_size;
        ogt_vox_scene * merged_scene = (ogt_vox_scene*)_vox_calloc(scene_size);

        // copy name and keyframe data into the misc_data section and make instances/groups point to it.
        // This makes the merged model self-contained.
        {
            char* scene_misc_data = (char*)&merged_scene[1];
            for (uint32_t instance_index = 0; instance_index < num_instances; instance_index++) {
                if (instances[instance_index].name) {
                    size_t string_len = _vox_strlen(instances[instance_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, instances[instance_index].name, string_len);
                    instances[instance_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (instances[instance_index].model_anim.num_keyframes) {
                    ogt_vox_keyframe_model* model_keyframes = (ogt_vox_keyframe_model*)scene_misc_data;
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_model) * instances[instance_index].model_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].model_anim.keyframes, keyframe_size);
                    instances[instance_index].model_anim.keyframes = model_keyframes;
                    scene_misc_data += keyframe_size;
                    // bias the model_index in model_keyframes back into the range for the scene that this instance came from.
                    for (int32_t scene_index = (int32_t)(per_scene_base_instance_index.size() - 1); scene_index >= 0; scene_index--) {
                        if (instance_index >= per_scene_base_instance_index[scene_index]) {
                            for (uint32_t j = 0; j < instances[instance_index].model_anim.num_keyframes; j++)
                                model_keyframes[j].model_index += per_scene_base_model_index[scene_index];
                            break;
                        }
                    }
                }
                if (instances[instance_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * instances[instance_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].transform_anim.keyframes, keyframe_size);
                    instances[instance_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }
            for (uint32_t group_index = 0; group_index < num_groups; group_index++) {
                if (groups[group_index].name) {
                    size_t string_len = _vox_strlen(groups[group_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, groups[group_index].name, string_len);
                    groups[group_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (groups[group_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * groups[group_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, groups[group_index].transform_anim.keyframes, keyframe_size);
                    groups[group_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }

            ogt_assert(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size), "misc_data allocation was overrun");
        }

        ogt_assert(num_groups <= max_groups, "sanity check failed. we wrote more groups than we allocated");

        memset(merged_scene, 0, sizeof(ogt_vox_scene));
        merged_scene->instances     = instances;
        merged_scene->num_instances = max_instances;
        merged_scene->models        = (const ogt_vox_model * *)models;
        merged_scene->num_models    = max_models;
        merged_scene->layers        = layers;
        merged_scene->num_layers    = max_layers;
        merged_scene->groups        = groups;
        merged_scene->num_groups    = num_groups;
        // copy color palette into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene->palette.color[color_index] = master_palette[color_index];
        // copy materials into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene-> materials.matl[color_index] = materials[color_index];

        return merged_scene;
    }